

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O0

void __thiscall spvtools::opt::SENode::AddChild(SENode *this,SENode *child)

{
  int iVar1;
  undefined4 extraout_var;
  const_iterator local_48;
  SENode **local_40;
  SENode **local_38;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  local_30;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  local_28;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  position;
  anon_class_8_1_a7bde43c find_first_less_than;
  SENode *child_local;
  SENode *this_local;
  
  find_first_less_than.child = child;
  iVar1 = (*this->_vptr_SENode[4])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    __assert_fail("false && \"Trying to add a child node to a constant!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                  ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
  }
  position._M_current = (SENode **)find_first_less_than.child;
  local_30._M_current =
       (SENode **)
       std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                 (&this->children_);
  local_38 = (SENode **)
             std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                       (&this->children_);
  local_40 = position._M_current;
  local_28 = std::
             find_if_not<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>
                       (local_30,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                  )local_38,position._M_current);
  __gnu_cxx::
  __normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>
  ::__normal_iterator<spvtools::opt::SENode**>
            ((__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>
              *)&local_48,&local_28);
  std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
            (&this->children_,local_48,&find_first_less_than.child);
  return;
}

Assistant:

virtual inline void AddChild(SENode* child) {
    // If this is a constant node, assert.
    if (AsSEConstantNode()) {
      assert(false && "Trying to add a child node to a constant!");
    }

    // Find the first point in the vector where |child| is greater than the node
    // currently in the vector.
    auto find_first_less_than = [child](const SENode* node) {
      return child->unique_id_ <= node->unique_id_;
    };

    auto position = std::find_if_not(children_.begin(), children_.end(),
                                     find_first_less_than);
    // Children are sorted so the hashing and equality operator will be the same
    // for a node with the same children. X+Y should be the same as Y+X.
    children_.insert(position, child);
  }